

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression.c
# Opt level: O0

exr_result_t exr_compress_chunk(exr_encode_pipeline_t *encode)

{
  exr_compression_t eVar1;
  exr_priv_part_t p_Var2;
  void *pvVar3;
  uint64_t uVar4;
  size_t sVar5;
  exr_result_t eVar6;
  size_t sVar7;
  exr_encode_pipeline_t *in_RDI;
  exr_encode_pipeline_t *in_stack_00000028;
  exr_encode_pipeline_t *in_stack_00000040;
  exr_encode_pipeline_t *in_stack_00000050;
  size_t pas;
  size_t pbb;
  void *pb;
  uint64_t sampsize;
  size_t maxbytes;
  exr_priv_part_t part;
  exr_context_t ctxt;
  exr_result_t rv;
  exr_encode_pipeline_t *in_stack_ffffffffffffff68;
  size_t *in_stack_ffffffffffffff70;
  void **in_stack_ffffffffffffff78;
  size_t *in_bytes;
  size_t *in_stack_ffffffffffffff80;
  exr_const_context_t p_Var8;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  undefined8 in_stack_ffffffffffffff90;
  _func_exr_result_t_exr_const_context_t_exr_result_t_char_ptr_varargs *p_Var9;
  exr_transcoding_pipeline_buffer_id_t bufid;
  exr_encode_pipeline_t *encode_00;
  int local_14;
  
  bufid = (exr_transcoding_pipeline_buffer_id_t)((ulong)in_stack_ffffffffffffff90 >> 0x20);
  if (in_RDI == (exr_encode_pipeline_t *)0x0) {
    return 2;
  }
  p_Var8 = in_RDI->context;
  if (p_Var8 == (exr_const_context_t)0x0) {
    return 2;
  }
  if ((in_RDI->part_index < 0) || (p_Var8->num_parts <= in_RDI->part_index)) {
    eVar6 = (*p_Var8->print_error)
                      (p_Var8,4,"Part index (%d) out of range",(ulong)(uint)in_RDI->part_index);
    return eVar6;
  }
  p_Var2 = p_Var8->parts[in_RDI->part_index];
  encode_00 = in_RDI;
  exr_compress_max_buffer_size((size_t)in_stack_ffffffffffffff78);
  eVar6 = internal_encode_alloc_buffer
                    (encode_00,bufid,
                     (void **)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                     in_stack_ffffffffffffff80,(size_t)in_stack_ffffffffffffff78);
  if (eVar6 != 0) {
    p_Var9 = p_Var8->print_error;
    sVar7 = exr_compress_max_buffer_size((size_t)in_stack_ffffffffffffff78);
    eVar6 = (*p_Var9)(p_Var8,eVar6,"error allocating buffer %zu",sVar7);
    return eVar6;
  }
  if (in_RDI->sample_count_table != (int32_t *)0x0) {
    sVar7 = (long)(in_RDI->chunk).width * (long)(in_RDI->chunk).height * 4;
    if (p_Var2->comp_type == EXR_COMPRESSION_NONE) {
      internal_encode_free_buffer
                ((exr_encode_pipeline_t *)
                 CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                 (exr_transcoding_pipeline_buffer_id_t)((ulong)in_stack_ffffffffffffff80 >> 0x20),
                 in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
      in_RDI->packed_sample_count_table = in_RDI->sample_count_table;
      in_RDI->packed_sample_count_alloc_size = 0;
      in_RDI->packed_sample_count_bytes = sVar7;
    }
    else {
      pvVar3 = in_RDI->packed_buffer;
      uVar4 = in_RDI->packed_bytes;
      sVar5 = in_RDI->packed_alloc_size;
      in_bytes = &in_RDI->packed_sample_count_alloc_size;
      in_stack_ffffffffffffff68 = in_RDI;
      exr_compress_max_buffer_size((size_t)in_bytes);
      eVar6 = internal_encode_alloc_buffer
                        (encode_00,bufid,
                         (void **)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                         in_stack_ffffffffffffff80,(size_t)in_bytes);
      if (eVar6 != 0) {
        return eVar6;
      }
      in_RDI->packed_buffer = in_RDI->packed_sample_count_table;
      in_RDI->packed_bytes = sVar7;
      in_RDI->packed_alloc_size = in_RDI->packed_sample_count_alloc_size;
      eVar1 = p_Var2->comp_type;
      if (eVar1 == EXR_COMPRESSION_NONE) {
        local_14 = 3;
      }
      else if (eVar1 == EXR_COMPRESSION_RLE) {
        local_14 = internal_exr_apply_rle(in_stack_ffffffffffffff68);
      }
      else if (eVar1 - EXR_COMPRESSION_ZIPS < 2) {
        local_14 = internal_exr_apply_zip(in_stack_ffffffffffffff68);
      }
      else {
        local_14 = 3;
      }
      in_RDI->packed_buffer = pvVar3;
      in_RDI->packed_bytes = uVar4;
      in_RDI->packed_alloc_size = sVar5;
      if (local_14 != 0) {
        eVar6 = (*p_Var8->print_error)(p_Var8,local_14,"Unable to compress sample table");
        return eVar6;
      }
    }
  }
  switch((exr_encode_pipeline_t *)(ulong)p_Var2->comp_type) {
  case (exr_encode_pipeline_t *)0x0:
    eVar6 = (*p_Var8->report_error)(p_Var8,3,"no compression set but still trying to compress");
    return eVar6;
  case (exr_encode_pipeline_t *)0x1:
    local_14 = internal_exr_apply_rle(in_stack_ffffffffffffff68);
    break;
  case (exr_encode_pipeline_t *)0x2:
  case (exr_encode_pipeline_t *)0x3:
    local_14 = internal_exr_apply_zip(in_stack_ffffffffffffff68);
    break;
  case (exr_encode_pipeline_t *)0x4:
    local_14 = internal_exr_apply_piz(in_stack_00000028);
    break;
  case (exr_encode_pipeline_t *)0x5:
    local_14 = internal_exr_apply_pxr24((exr_encode_pipeline_t *)(ulong)p_Var2->comp_type);
    break;
  case (exr_encode_pipeline_t *)0x6:
    local_14 = internal_exr_apply_b44((exr_encode_pipeline_t *)0x153afe);
    break;
  case (exr_encode_pipeline_t *)0x7:
    local_14 = internal_exr_apply_b44a((exr_encode_pipeline_t *)0x153b17);
    break;
  case (exr_encode_pipeline_t *)0x8:
    local_14 = internal_exr_apply_dwaa(in_stack_00000050);
    break;
  case (exr_encode_pipeline_t *)0x9:
    local_14 = internal_exr_apply_dwab(in_stack_00000040);
    break;
  case (exr_encode_pipeline_t *)0xa:
  default:
    eVar6 = (*p_Var8->print_error)
                      (p_Var8,3,"Compression technique 0x%02X invalid",(ulong)p_Var2->comp_type);
    return eVar6;
  }
  return local_14;
}

Assistant:

exr_result_t
exr_compress_chunk (exr_encode_pipeline_t* encode)
{
    exr_result_t    rv;
    exr_context_t   ctxt;
    exr_priv_part_t part;
    size_t          maxbytes;

    if (!encode) return EXR_ERR_MISSING_CONTEXT_ARG;
    ctxt = (exr_context_t) encode->context;
    if (!ctxt) return EXR_ERR_MISSING_CONTEXT_ARG;

    /* TODO: Double check need for a lock? */
    if (encode->part_index < 0 || encode->part_index >= ctxt->num_parts)
        return ctxt->print_error (
            ctxt,
            EXR_ERR_ARGUMENT_OUT_OF_RANGE,
            "Part index (%d) out of range",
            encode->part_index);

    part = ctxt->parts[encode->part_index];

    maxbytes = encode->chunk.unpacked_size;
    if (encode->packed_bytes > maxbytes)
        maxbytes = encode->packed_bytes;

    rv = internal_encode_alloc_buffer (
        encode,
        EXR_TRANSCODE_BUFFER_COMPRESSED,
        &(encode->compressed_buffer),
        &(encode->compressed_alloc_size),
        exr_compress_max_buffer_size (maxbytes));
    if (rv != EXR_ERR_SUCCESS)
        return ctxt->print_error (
            ctxt,
            rv,
            "error allocating buffer %zu",
            exr_compress_max_buffer_size (maxbytes));
    //return rv;

    if (encode->sample_count_table)
    {
        uint64_t sampsize =
            (((uint64_t) encode->chunk.width) *
             ((uint64_t) encode->chunk.height));

        sampsize *= sizeof (int32_t);

        if (part->comp_type == EXR_COMPRESSION_NONE)
        {
            internal_encode_free_buffer (
                encode,
                EXR_TRANSCODE_BUFFER_PACKED_SAMPLES,
                &(encode->packed_sample_count_table),
                &(encode->packed_sample_count_alloc_size));

            encode->packed_sample_count_table      = encode->sample_count_table;
            encode->packed_sample_count_alloc_size = 0;
            encode->packed_sample_count_bytes = sampsize;
        }
        else
        {
            void *pb;
            size_t pbb, pas;

            pb = encode->packed_buffer;
            pbb = encode->packed_bytes;
            pas = encode->packed_alloc_size;

            rv = internal_encode_alloc_buffer (
                encode,
                EXR_TRANSCODE_BUFFER_PACKED_SAMPLES,
                &(encode->packed_sample_count_table),
                &(encode->packed_sample_count_alloc_size),
                exr_compress_max_buffer_size (sampsize));
            if (rv != EXR_ERR_SUCCESS)
                return rv;

            encode->packed_buffer = encode->packed_sample_count_table;
            encode->packed_bytes = sampsize;
            encode->packed_alloc_size = encode->packed_sample_count_alloc_size;
            switch (part->comp_type)
            {
                case EXR_COMPRESSION_NONE: rv = EXR_ERR_INVALID_ARGUMENT; break;
                case EXR_COMPRESSION_RLE: rv = internal_exr_apply_rle (encode); break;
                case EXR_COMPRESSION_ZIP:
                case EXR_COMPRESSION_ZIPS: rv = internal_exr_apply_zip (encode); break;

                default:
                    rv = EXR_ERR_INVALID_ARGUMENT;
                    break;
            }
            encode->packed_buffer = pb;
            encode->packed_bytes = pbb;
            encode->packed_alloc_size = pas;

            if (rv != EXR_ERR_SUCCESS)
                return ctxt->print_error (
                    ctxt,
                    rv,
                    "Unable to compress sample table");
        }
    }

    switch (part->comp_type)
    {
        case EXR_COMPRESSION_NONE:
            return ctxt->report_error (
                ctxt,
                EXR_ERR_INVALID_ARGUMENT,
                "no compression set but still trying to compress");

        case EXR_COMPRESSION_RLE: rv = internal_exr_apply_rle (encode); break;
        case EXR_COMPRESSION_ZIP:
        case EXR_COMPRESSION_ZIPS: rv = internal_exr_apply_zip (encode); break;
        case EXR_COMPRESSION_PIZ: rv = internal_exr_apply_piz (encode); break;
        case EXR_COMPRESSION_PXR24:
            rv = internal_exr_apply_pxr24 (encode);
            break;
        case EXR_COMPRESSION_B44: rv = internal_exr_apply_b44 (encode); break;
        case EXR_COMPRESSION_B44A: rv = internal_exr_apply_b44a (encode); break;
        case EXR_COMPRESSION_DWAA: rv = internal_exr_apply_dwaa (encode); break;
        case EXR_COMPRESSION_DWAB: rv = internal_exr_apply_dwab (encode); break;
        case EXR_COMPRESSION_LAST_TYPE:
        default:
            return ctxt->print_error (
                ctxt,
                EXR_ERR_INVALID_ARGUMENT,
                "Compression technique 0x%02X invalid",
                (int) part->comp_type);
    }
    return rv;
}